

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_progress.c
# Opt level: O3

int xferinfo_cb(void *clientp,curl_off_t dltotal,curl_off_t dlnow,curl_off_t ultotal,
               curl_off_t ulnow)

{
  per_transfer *per;
  
  *(curl_off_t *)((long)clientp + 0x288) = dltotal;
  *(curl_off_t *)((long)clientp + 0x290) = dlnow;
  *(curl_off_t *)((long)clientp + 0x298) = ultotal;
  *(curl_off_t *)((long)clientp + 0x2a0) = ulnow;
  if (*(char *)(*(long *)((long)clientp + 0x10) + 0x2fa) == '\x01') {
    *(undefined1 *)(*(long *)((long)clientp + 0x10) + 0x2fa) = 0;
    curl_easy_pause(*(undefined8 *)((long)clientp + 0x18),0);
  }
  return 0;
}

Assistant:

int xferinfo_cb(void *clientp,
                curl_off_t dltotal,
                curl_off_t dlnow,
                curl_off_t ultotal,
                curl_off_t ulnow)
{
  struct per_transfer *per = clientp;
  struct OperationConfig *config = per->config;
  per->dltotal = dltotal;
  per->dlnow = dlnow;
  per->ultotal = ultotal;
  per->ulnow = ulnow;

  if(config->readbusy) {
    config->readbusy = FALSE;
    curl_easy_pause(per->curl, CURLPAUSE_CONT);
  }

  return 0;
}